

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int compare_set_of_element(void *a_ptr,void *b_ptr)

{
  size_t sVar1;
  size_t sVar2;
  uint8_t *s1;
  uint8_t *s2;
  size_t local_58;
  int ret;
  size_t min_len;
  size_t b_len;
  size_t a_len;
  CBS *b;
  CBS *a;
  void *b_ptr_local;
  void *a_ptr_local;
  
  sVar1 = CBS_len((CBS *)a_ptr);
  sVar2 = CBS_len((CBS *)b_ptr);
  local_58 = sVar2;
  if (sVar1 < sVar2) {
    local_58 = sVar1;
  }
  s1 = CBS_data((CBS *)a_ptr);
  s2 = CBS_data((CBS *)b_ptr);
  a_ptr_local._4_4_ = OPENSSL_memcmp(s1,s2,local_58);
  if (a_ptr_local._4_4_ == 0) {
    if (sVar1 == sVar2) {
      a_ptr_local._4_4_ = 0;
    }
    else {
      a_ptr_local._4_4_ = 1;
      if (sVar1 < sVar2) {
        a_ptr_local._4_4_ = -1;
      }
    }
  }
  return a_ptr_local._4_4_;
}

Assistant:

static int compare_set_of_element(const void *a_ptr, const void *b_ptr) {
  // See X.690, section 11.6 for the ordering. They are sorted in ascending
  // order by their DER encoding.
  const CBS *a = reinterpret_cast<const CBS *>(a_ptr),
            *b = reinterpret_cast<const CBS *>(b_ptr);
  size_t a_len = CBS_len(a), b_len = CBS_len(b);
  size_t min_len = a_len < b_len ? a_len : b_len;
  int ret = OPENSSL_memcmp(CBS_data(a), CBS_data(b), min_len);
  if (ret != 0) {
    return ret;
  }
  if (a_len == b_len) {
    return 0;
  }
  // If one is a prefix of the other, the shorter one sorts first. (This is not
  // actually reachable. No DER encoding is a prefix of another DER encoding.)
  return a_len < b_len ? -1 : 1;
}